

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicRMW
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicRMW *curr)

{
  AtomicRMW AVar1;
  Name memoryName;
  Name memory;
  Name memoryName_00;
  undefined1 this_00 [8];
  Address memorySize;
  Literal *pLVar2;
  Address addr;
  undefined1 local_168 [8];
  Flow ptr;
  Flow value;
  Literal local_c0;
  Literal local_a8;
  undefined1 local_90 [8];
  MemoryInstanceInfo info;
  Literal loaded;
  Literal computed;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_168,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x20));
  if (ptr.breakTo.super_IString.str._M_len != 0) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_168);
    goto LAB_0013787d;
  }
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&ptr.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x28));
  if (value.breakTo.super_IString.str._M_len == 0) {
    getMemoryInstanceInfo((MemoryInstanceInfo *)local_90,this,(Name)*(string_view *)(curr + 0x30));
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory);
    this_00 = local_90;
    pLVar2 = Flow::getSingleValue((Flow *)local_168);
    wasm::Literal::Literal((Literal *)&value.breakTo.super_IString.str._M_str,pLVar2);
    addr = getFinalAddress<wasm::AtomicRMW>
                     ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                      (Literal *)&value.breakTo.super_IString.str._M_str,memorySize);
    wasm::Literal::~Literal((Literal *)&value.breakTo.super_IString.str._M_str);
    memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memoryName.super_IString.str._M_len = (size_t)info.instance;
    doAtomicLoad((Literal *)&info.name.super_IString.str._M_str,
                 (ModuleRunnerBase<wasm::ModuleRunner> *)local_90,addr,(uint)(byte)curr[0x14],
                 (Type)*(uintptr_t *)(curr + 8),memoryName,memorySize);
    pLVar2 = Flow::getSingleValue((Flow *)&ptr.breakTo.super_IString.str._M_str);
    wasm::Literal::Literal((Literal *)&loaded.type,pLVar2);
    switch(*(undefined4 *)(curr + 0x10)) {
    case 0:
      wasm::Literal::add((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case 1:
      wasm::Literal::sub((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case 2:
      wasm::Literal::and_((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case 3:
      wasm::Literal::or_((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case 4:
      wasm::Literal::xor_((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    default:
      goto switchD_00137742_default;
    }
    wasm::Literal::~Literal((Literal *)&computed.type);
switchD_00137742_default:
    AVar1 = curr[0x14];
    wasm::Literal::Literal(&local_c0,(Literal *)&loaded.type);
    memoryName_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memoryName_00.super_IString.str._M_len = (size_t)info.instance;
    doAtomicStore((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,addr,(uint)(byte)AVar1,&local_c0,
                  memoryName_00,memorySize);
    wasm::Literal::~Literal(&local_c0);
    wasm::Literal::Literal(&local_a8,(Literal *)&info.name.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a8);
    wasm::Literal::~Literal(&local_a8);
    wasm::Literal::~Literal((Literal *)&loaded.type);
    wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
LAB_0013787d:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_168);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicRMW(AtomicRMW* curr) {
    NOTE_ENTER("AtomicRMW");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    auto value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    NOTE_EVAL1(ptr);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), memorySize);
    NOTE_EVAL1(addr);
    NOTE_EVAL1(value);
    auto loaded = info.instance->doAtomicLoad(
      addr, curr->bytes, curr->type, info.name, memorySize);
    NOTE_EVAL1(loaded);
    auto computed = value.getSingleValue();
    switch (curr->op) {
      case RMWAdd:
        computed = loaded.add(computed);
        break;
      case RMWSub:
        computed = loaded.sub(computed);
        break;
      case RMWAnd:
        computed = loaded.and_(computed);
        break;
      case RMWOr:
        computed = loaded.or_(computed);
        break;
      case RMWXor:
        computed = loaded.xor_(computed);
        break;
      case RMWXchg:
        break;
    }
    info.instance->doAtomicStore(
      addr, curr->bytes, computed, info.name, memorySize);
    return loaded;
  }